

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsBandDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                  ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  int iVar6;
  realtype *prVar7;
  realtype *prVar8;
  realtype *prVar9;
  realtype *prVar10;
  realtype *prVar11;
  realtype *prVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  realtype rVar24;
  double dVar25;
  double dVar26;
  uint local_cc;
  double local_c0;
  realtype *local_b0;
  double local_a8;
  
  uVar3 = SUNBandMatrix_Columns(Jac);
  sVar4 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar5 = SUNBandMatrix_LowerBandwidth(Jac);
  prVar7 = N_VGetArrayPointer(ark_mem->ewt);
  prVar8 = N_VGetArrayPointer(fy);
  prVar9 = N_VGetArrayPointer(tmp1);
  prVar10 = N_VGetArrayPointer(y);
  prVar11 = N_VGetArrayPointer(tmp2);
  if (ark_mem->constraintsSet == 0) {
    local_b0 = (realtype *)0x0;
  }
  else {
    local_b0 = N_VGetArrayPointer(ark_mem->constraints);
  }
  local_a8 = 1.0;
  N_VScale(1.0,y,tmp2);
  dVar25 = ark_mem->uround;
  local_c0 = 0.0;
  if (0.0 < dVar25) {
    if (dVar25 < 0.0) {
      local_c0 = sqrt(dVar25);
    }
    else {
      local_c0 = SQRT(dVar25);
    }
  }
  rVar24 = N_VWrmsNorm(fy,ark_mem->rwt);
  if ((rVar24 != 0.0) || (NAN(rVar24))) {
    local_a8 = rVar24 * (double)(int)uVar3 * ABS(ark_mem->h) * 1000.0 * ark_mem->uround;
  }
  uVar21 = sVar4 + sVar5 + 1;
  uVar2 = uVar3;
  if ((int)uVar21 < (int)uVar3) {
    uVar2 = uVar21;
  }
  if (0 < (int)uVar2) {
    lVar17 = (long)(int)uVar21;
    local_cc = -sVar4;
    lVar20 = 0;
    uVar15 = 0;
    do {
      iVar6 = ark_mem->constraintsSet;
      uVar14 = uVar15;
      do {
        dVar25 = ABS(prVar10[uVar14]) * local_c0;
        if (ABS(prVar10[uVar14]) * local_c0 <= local_a8 / prVar7[uVar14]) {
          dVar25 = local_a8 / prVar7[uVar14];
        }
        if (iVar6 != 0) {
          dVar1 = local_b0[uVar14];
          dVar26 = ABS(dVar1);
          if ((dVar26 != 1.0) || (NAN(dVar26))) {
            if ((dVar26 == 2.0) && ((!NAN(dVar26) && (dVar1 * (prVar11[uVar14] + dVar25) <= 0.0))))
            goto LAB_004108ad;
          }
          else if (dVar1 * (prVar11[uVar14] + dVar25) < 0.0) {
LAB_004108ad:
            dVar25 = -dVar25;
          }
        }
        prVar11[uVar14] = dVar25 + prVar11[uVar14];
        uVar14 = uVar14 + lVar17;
      } while ((long)uVar14 < (long)(int)uVar3);
      iVar6 = (*fi)(ark_mem->tcur,tmp2,tmp1,ark_mem->user_data);
      arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
      lVar18 = lVar20;
      uVar14 = uVar15;
      uVar19 = local_cc;
      if (iVar6 != 0) {
        return iVar6;
      }
      do {
        uVar22 = 0;
        if (0 < (int)uVar19) {
          uVar22 = (ulong)uVar19;
        }
        prVar11[uVar14] = prVar10[uVar14];
        iVar6 = (int)uVar14;
        prVar12 = SUNBandMatrix_Column(Jac,iVar6);
        dVar25 = ABS(prVar10[uVar14]) * local_c0;
        if (ABS(prVar10[uVar14]) * local_c0 <= local_a8 / prVar7[uVar14]) {
          dVar25 = local_a8 / prVar7[uVar14];
        }
        if (ark_mem->constraintsSet != 0) {
          dVar1 = local_b0[uVar14];
          dVar26 = ABS(dVar1);
          if ((dVar26 != 1.0) || (NAN(dVar26))) {
            if ((dVar26 == 2.0) && ((!NAN(dVar26) && (dVar1 * (prVar11[uVar14] + dVar25) <= 0.0))))
            goto LAB_00410a07;
          }
          else if (dVar1 * (prVar11[uVar14] + dVar25) < 0.0) {
LAB_00410a07:
            dVar25 = -dVar25;
          }
        }
        iVar16 = iVar6 - sVar4;
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        iVar13 = sVar5 + iVar6;
        if ((int)(uVar3 - 1) <= sVar5 + iVar6) {
          iVar13 = uVar3 - 1;
        }
        if (iVar16 <= iVar13) {
          lVar23 = uVar22 - 1;
          do {
            *(double *)((long)prVar12 + lVar23 * 8 + lVar18 + 8) =
                 (prVar9[lVar23 + 1] - prVar8[lVar23 + 1]) * (1.0 / dVar25);
            lVar23 = lVar23 + 1;
          } while (lVar23 < iVar13);
        }
        uVar14 = uVar14 + lVar17;
        lVar18 = lVar18 + lVar17 * -8;
        uVar19 = uVar19 + uVar21;
      } while ((long)uVar14 < (long)(int)uVar3);
      uVar15 = uVar15 + 1;
      local_cc = local_cc + 1;
      lVar20 = lVar20 + -8;
    } while (uVar15 != uVar2);
  }
  return 0;
}

Assistant:

int arkLsBandDQJac(realtype t, N_Vector y, N_Vector fy,
                   SUNMatrix Jac, ARKodeMem ark_mem,
                   ARKLsMem arkls_mem, ARKRhsFn fi,
                   N_Vector tmp1, N_Vector tmp2)
{
  N_Vector     ftemp, ytemp;
  realtype     fnorm, minInc, inc, inc_inv, srur, conj;
  realtype    *col_j, *ewt_data, *fy_data, *ftemp_data, *y_data, *ytemp_data;
  realtype    *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  int          retval = 0;

  /* access matrix dimensions */
  N = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(ark_mem->ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  cns_data = (ark_mem->constraintsSet) ?
    N_VGetArrayPointer(ark_mem->constraints) : NULL;

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(ark_mem->uround);
  fnorm = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm) : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group=1; group <= ngroups; group++) {

    /* Increment all y_j in group */
    for(j=group-1; j < N; j+=width) {
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (ark_mem->constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = fi(ark_mem->tcur, ytemp, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) break;

    /* Restore ytemp, then form and load difference quotients */
    for (j=group-1; j < N; j+=width) {
      ytemp_data[j] = y_data[j];
      col_j = SUNBandMatrix_Column(Jac, j);
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (ark_mem->constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      inc_inv = ONE/inc;
      i1 = SUNMAX(0, j-mupper);
      i2 = SUNMIN(j+mlower, N-1);
      for (i=i1; i <= i2; i++)
        SM_COLUMN_ELEMENT_B(col_j,i,j) = inc_inv * (ftemp_data[i] - fy_data[i]);
    }
  }

  return(retval);
}